

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall DReachabilityPropagator::wakeup(DReachabilityPropagator *this,int i,int param_2)

{
  int iVar1;
  BoolView *pBVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint local_1c;
  DReachabilityPropagator *local_18;
  
  iVar1 = (this->in_nodes_tsize).v;
  local_1c = i;
  if (iVar1 < this->in_nodes_size) {
    std::vector<int,_std::allocator<int>_>::resize(&this->in_nodes_list,(long)iVar1);
    this->in_nodes_size = (this->in_nodes_tsize).v;
  }
  bVar3 = true;
  if ((-1 < i) && (i < (int)(this->super_GraphPropagator).vs.sz)) {
    pBVar2 = (this->super_GraphPropagator).vs.data;
    uVar5 = (uint)pBVar2[(uint)i].s;
    if ((uVar5 * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[(uint)i].v]) &&
       (this->last_state_n[(uint)i].v != 0)) {
      add_innode(this,i);
      lVar6 = 0xd8;
    }
    else if ((uVar5 * 2 + -1 != (int)sat.assigns.data[(uint)pBVar2[(uint)i].v]) ||
            (lVar6 = 0x108, this->last_state_n[(uint)i].v == 1)) goto LAB_001cd615;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               ((long)&(this->super_GraphPropagator).super_Propagator._vptr_Propagator + lVar6),
               (int *)&local_1c);
    bVar3 = false;
  }
LAB_001cd615:
  uVar5 = (this->super_GraphPropagator).vs.sz;
  uVar4 = local_1c - uVar5;
  if (((int)uVar5 <= (int)local_1c) &&
     ((int)local_1c < (int)(uVar5 + (this->super_GraphPropagator).es.sz))) {
    pBVar2 = (this->super_GraphPropagator).es.data;
    uVar5 = (uint)pBVar2[uVar4].s;
    local_1c = uVar4;
    if (((uVar5 * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[uVar4].v]) &&
        (lVar6 = 0x138, this->last_state_e[(int)uVar4].v != 0)) ||
       ((uVar5 * 2 + -1 == (int)sat.assigns.data[(uint)pBVar2[uVar4].v] &&
        (lVar6 = 0x168, this->last_state_e[(int)uVar4].v != 1)))) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((long)&(this->super_GraphPropagator).super_Propagator._vptr_Propagator + lVar6),
                 (int *)&local_1c);
      goto LAB_001cd6a2;
    }
  }
  if (bVar3) {
    return;
  }
LAB_001cd6a2:
  if ((this->super_GraphPropagator).super_Propagator.in_queue == false) {
    (this->super_GraphPropagator).super_Propagator.in_queue = true;
    local_18 = this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_GraphPropagator).super_Propagator.priority,
               (Propagator **)&local_18);
  }
  return;
}

Assistant:

void DReachabilityPropagator::wakeup(int i, int /*c*/) {
	update_innodes();

	bool ignore = true;
	if (DEBUG) {
		std::cout << "Wake up " << i << '\n';
	}
	if (i >= 0 && i < nbNodes()) {
		assert(getNodeVar(i).isFixed());
		if (getNodeVar(i).isTrue() && last_state_n[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add node " << i << '\n';
			}
			if (DEBUG) {
				std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
			}
			add_innode(i);
			new_node.insert(i);
			ignore = false;
		} else if (getNodeVar(i).isFalse() && last_state_n[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem node " << i << '\n';
			}
			rem_node.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring node " << i << '\n';
			}
		}
	}

	if (i >= nbNodes() && i < nbNodes() + nbEdges()) {
		i = i - nbNodes();
		assert(getEdgeVar(i).isFixed());
		if (getEdgeVar(i).isTrue() && last_state_e[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add edge" << i << '\n';
			}
			new_edge.insert(i);
			ignore = false;
		} else if (getEdgeVar(i).isFalse() && last_state_e[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem edge " << i << '\n';
			}
			rem_edge.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring edge " << i << '\n';
			}
		}
	}

	if (!ignore) {
		pushInQueue();
	} else {
	}
}